

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls_record.cc
# Opt level: O2

size_t bssl::dtls_max_seal_overhead(SSL *ssl,uint16_t epoch)

{
  bool bVar1;
  DTLSWriteEpoch *pDVar2;
  size_t sVar3;
  size_t sVar4;
  
  pDVar2 = dtls_get_write_epoch(ssl,epoch);
  if (pDVar2 == (DTLSWriteEpoch *)0x0) {
    sVar4 = 0;
  }
  else {
    sVar3 = dtls_record_header_write_len(ssl,epoch);
    sVar4 = SSLAEADContext::MaxOverhead
                      ((pDVar2->aead)._M_t.
                       super___uniq_ptr_impl<bssl::SSLAEADContext,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bssl::SSLAEADContext_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bssl::SSLAEADContext_*,_false>._M_head_impl);
    bVar1 = use_dtls13_record_header(ssl,epoch);
    sVar4 = bVar1 + sVar3 + sVar4;
  }
  return sVar4;
}

Assistant:

size_t dtls_max_seal_overhead(const SSL *ssl, uint16_t epoch) {
  DTLSWriteEpoch *write_epoch = dtls_get_write_epoch(ssl, epoch);
  if (write_epoch == nullptr) {
    return 0;
  }
  size_t ret = dtls_record_header_write_len(ssl, epoch) +
               write_epoch->aead->MaxOverhead();
  if (use_dtls13_record_header(ssl, epoch)) {
    // Add 1 byte for the encrypted record type.
    ret++;
  }
  return ret;
}